

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Vdbe * sqlite3VdbeCreate(Parse *pParse)

{
  sqlite3 *db;
  Vdbe *pVVar1;
  Vdbe *pVVar2;
  
  db = pParse->db;
  pVVar2 = (Vdbe *)sqlite3DbMallocRawNN(db,0x120);
  if (pVVar2 == (Vdbe *)0x0) {
    pVVar2 = (Vdbe *)0x0;
  }
  else {
    memset(&pVVar2->aOp,0,0xb8);
    pVVar2->db = db;
    pVVar1 = db->pVdbe;
    if (pVVar1 != (Vdbe *)0x0) {
      pVVar1->pPrev = pVVar2;
    }
    pVVar2->pNext = pVVar1;
    pVVar2->pPrev = (Vdbe *)0x0;
    db->pVdbe = pVVar2;
    pVVar2->magic = 0x16bceaa5;
    pVVar2->pParse = pParse;
  }
  return pVVar2;
}

Assistant:

SQLITE_PRIVATE Vdbe *sqlite3VdbeCreate(Parse *pParse){
  sqlite3 *db = pParse->db;
  Vdbe *p;
  p = sqlite3DbMallocRawNN(db, sizeof(Vdbe) );
  if( p==0 ) return 0;
  memset(&p->aOp, 0, sizeof(Vdbe)-offsetof(Vdbe,aOp));
  p->db = db;
  if( db->pVdbe ){
    db->pVdbe->pPrev = p;
  }
  p->pNext = db->pVdbe;
  p->pPrev = 0;
  db->pVdbe = p;
  p->magic = VDBE_MAGIC_INIT;
  p->pParse = pParse;
  assert( pParse->aLabel==0 );
  assert( pParse->nLabel==0 );
  assert( pParse->nOpAlloc==0 );
  assert( pParse->szOpAlloc==0 );
  return p;
}